

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *offsets,uchar *head)

{
  size_type sVar1;
  void *pvVar2;
  uchar **ppuVar3;
  const_reference pvVar4;
  size_t *psVar5;
  long in_RCX;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_RDX;
  long in_RSI;
  long *in_RDI;
  int c;
  int num_lines;
  int end_line_no;
  int data_len_1;
  int line_no;
  uchar *data_ptr_1;
  size_t y_idx;
  int y;
  int data_len;
  int tile_coordinates [4];
  uchar *data_ptr;
  size_t tile_idx;
  size_t num_tiles;
  size_t channel_offset;
  int pixel_data_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  size_t num_blocks;
  int data_height;
  int data_width;
  int num_scanline_blocks;
  int num_channels;
  int in_stack_000001c8;
  int in_stack_000001d0;
  int in_stack_000001d8;
  size_t in_stack_000001e0;
  size_t in_stack_000001e8;
  EXRAttribute *in_stack_000001f0;
  size_t in_stack_000001f8;
  EXRChannelInfo *in_stack_00000200;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000208;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  uint in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  size_t in_stack_fffffffffffffe78;
  long lVar6;
  uchar *in_stack_fffffffffffffe80;
  int *in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffe98;
  uchar **in_stack_fffffffffffffea0;
  undefined1 *puVar7;
  int in_stack_ffffffffffffff00;
  int local_fc;
  int in_stack_ffffffffffffff08;
  int local_f4;
  int in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff18;
  uint local_e4;
  size_t in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int iVar8;
  uint uVar9;
  size_t num_channels_00;
  EXRChannelInfo *channels;
  ulong local_b0;
  undefined1 local_80 [24];
  size_type local_68;
  int local_60;
  int local_5c;
  undefined4 local_58;
  undefined4 local_54;
  long local_50;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_48;
  long local_40;
  long *local_38;
  
  local_54 = *(undefined4 *)(in_RSI + 0x10870);
  local_58 = 1;
  if (*(int *)(in_RSI + 0x10888) == 3) {
    local_58 = 0x10;
  }
  else if (*(int *)(in_RSI + 0x10888) == 4) {
    local_58 = 0x20;
  }
  else if (*(int *)(in_RSI + 0x10888) == 0x80) {
    local_58 = 0x10;
  }
  local_5c = (*(int *)(in_RSI + 0x10) - *(int *)(in_RSI + 8)) + 1;
  local_60 = (*(int *)(in_RSI + 0x14) - *(int *)(in_RSI + 0xc)) + 1;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  local_68 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size(in_RDX);
  puVar7 = local_80;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16160c);
  ComputeChannelLayout
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (size_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe1c,
             (EXRChannelInfo *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  if (*(int *)(local_40 + 0x38) == 0) {
    ppuVar3 = AllocateImage(in_stack_fffffffffffffe34,
                            (EXRChannelInfo *)
                            CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                            (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
    local_38[1] = (long)ppuVar3;
    iVar8 = 0;
    while( true ) {
      if ((int)local_68 <= iVar8) break;
      lVar6 = local_50;
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (local_48,(long)iVar8);
      local_e4 = *(uint *)(lVar6 + *pvVar4);
      swap4(&local_e4);
      swap4((uint *)&stack0xffffffffffffff18);
      local_f4 = *(int *)(local_40 + 0x14) + 1;
      in_stack_fffffffffffffe20 = iVar8;
      std::min<int>((int *)&stack0xffffffffffffff10,&local_f4);
      local_e4 = local_e4 - *(int *)(local_40 + 0xc);
      iVar8 = in_stack_fffffffffffffe20;
      DecodePixelData(_num_scanline_blocks,_data_height,(uchar *)num_blocks,
                      (size_t)channel_offset_list.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                      channel_offset_list.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      (int)channel_offset_list.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,(int)offsets,(int)exr_header,
                      (int)exr_image,in_stack_000001c8,in_stack_000001d0,in_stack_000001d8,
                      in_stack_000001e0,in_stack_000001e8,in_stack_000001f0,in_stack_000001f8,
                      in_stack_00000200,in_stack_00000208);
      iVar8 = iVar8 + 1;
    }
  }
  else {
    sVar1 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size(local_48);
    pvVar2 = malloc(sVar1 << 5);
    *local_38 = (long)pvVar2;
    for (local_b0 = 0; local_b0 < sVar1; local_b0 = local_b0 + 1) {
      ppuVar3 = AllocateImage(in_stack_fffffffffffffe34,
                              (EXRChannelInfo *)
                              CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                              (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
      lVar6 = local_50;
      *(uchar ***)(*local_38 + 0x18 + local_b0 * 0x20) = ppuVar3;
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (local_48,local_b0);
      iVar8 = (int)ppuVar3;
      psVar5 = (size_t *)(lVar6 + *pvVar4);
      num_channels_00 = *psVar5;
      channels = (EXRChannelInfo *)psVar5[1];
      swap4((uint *)&stack0xffffffffffffff38);
      swap4((uint *)&stack0xffffffffffffff3c);
      swap4((uint *)&stack0xffffffffffffff40);
      swap4((uint *)&stack0xffffffffffffff44);
      uVar9 = (uint)psVar5[2];
      swap4((uint *)&stack0xffffffffffffff34);
      in_stack_fffffffffffffe28 = (uint)num_channels_00;
      in_stack_fffffffffffffe18 = local_5c;
      in_stack_fffffffffffffe20 = local_60;
      DecodeTiledPixelData
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,0,
                 (int)*(undefined8 *)(local_40 + 0x10880),iVar8,(int)puVar7,
                 in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                 (EXRAttribute *)CONCAT44(uVar9,in_stack_ffffffffffffff30),num_channels_00,channels,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)psVar5 + 0x14));
      *(uint *)(*local_38 + local_b0 * 0x20) = (uint)num_channels_00;
      *(uint *)(*local_38 + local_b0 * 0x20 + 4) = (uint)(num_channels_00 >> 0x20);
      *(uint *)(*local_38 + local_b0 * 0x20 + 8) = (uint)channels;
      *(uint *)(*local_38 + local_b0 * 0x20 + 0xc) = (uint)((ulong)channels >> 0x20);
      *(int *)((long)local_38 + 0x1c) = (int)sVar1;
    }
  }
  for (local_fc = 0; local_fc < *(int *)(local_40 + 0x10870); local_fc = local_fc + 1) {
    *(undefined4 *)(*(long *)(local_40 + 0x10878) + (long)local_fc * 4) =
         *(undefined4 *)(*(long *)(local_40 + 0x10880) + (long)local_fc * 4);
  }
  *(undefined4 *)(local_38 + 3) = local_54;
  *(int *)(local_38 + 2) = local_5c;
  *(int *)((long)local_38 + 0x14) = local_60;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  return 0;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<unsigned long long> &offsets,
                       const unsigned char *head) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;
  }

  int data_width = exr_header->data_window[2] - exr_header->data_window[0] + 1;
  int data_height = exr_header->data_window[3] - exr_header->data_window[1] + 1;

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                &channel_offset, num_channels,
                                exr_header->channels);

  if (exr_header->tiled) {
    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        malloc(sizeof(EXRTile) * static_cast<size_t>(num_tiles)));

    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
      // Allocate memory for each tile.
      exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
          num_channels, exr_header->channels, exr_header->requested_pixel_types,
          data_width, data_height);

      // 16 byte: tile coordinates
      // 4 byte : data size
      // ~      : data(uncompressed or compressed)
      const unsigned char *data_ptr =
          reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

      int tile_coordinates[4];
      memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[0]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[1]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[2]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[3]));

      // @todo{ LoD }
      assert(tile_coordinates[2] == 0);
      assert(tile_coordinates[3] == 0);

      int data_len;
      memcpy(&data_len, data_ptr + 16,
             sizeof(int));  // 16 = sizeof(tile_coordinates)
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));
      assert(data_len >= 4);

      // Move to data addr: 20 = 16 + 4;
      data_ptr += 20;

      tinyexr::DecodeTiledPixelData(
          exr_image->tiles[tile_idx].images,
          &(exr_image->tiles[tile_idx].width),
          &(exr_image->tiles[tile_idx].height),
          exr_header->requested_pixel_types, data_ptr,
          static_cast<size_t>(data_len), exr_header->compression_type,
          exr_header->line_order, data_width, data_height, tile_coordinates[0],
          tile_coordinates[1], exr_header->tile_size_x, exr_header->tile_size_y,
          static_cast<size_t>(pixel_data_size),
          static_cast<int>(exr_header->num_custom_attributes),
          exr_header->custom_attributes,
          static_cast<size_t>(exr_header->num_channels), exr_header->channels,
          channel_offset_list);

      exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
      exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
      exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
      exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

      exr_image->num_tiles = static_cast<int>(num_tiles);
    }
  } else {  // scanline format

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#ifdef _OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {
      size_t y_idx = static_cast<size_t>(y);
      const unsigned char *data_ptr =
          reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);
      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(uncompressed or compressed)
      int line_no;
      memcpy(&line_no, data_ptr, sizeof(int));
      int data_len;
      memcpy(&data_len, data_ptr + 4, sizeof(int));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&line_no));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

      int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                   (exr_header->data_window[3] + 1));

      int num_lines = end_line_no - line_no;
      assert(num_lines > 0);

      // printf("num_blocks = %lu, y = %d, lineno = %d, end_line_no = %d,
      // num_lines = %d, data_len = %d\n", num_blocks, y, line_no, end_line_no,
      // num_lines, data_len);

      // Move to data addr: 8 = 4 + 4;
      data_ptr += 8;

      // Adjust line_no with data_window.bmin.y
      line_no -= exr_header->data_window[1];

      tinyexr::DecodePixelData(
          exr_image->images, exr_header->requested_pixel_types, data_ptr,
          static_cast<size_t>(data_len), exr_header->compression_type,
          exr_header->line_order, data_width, data_height, data_width, y,
          line_no, num_lines, static_cast<size_t>(pixel_data_size),
          static_cast<int>(exr_header->num_custom_attributes),
          exr_header->custom_attributes,
          static_cast<size_t>(exr_header->num_channels), exr_header->channels,
          channel_offset_list);
    }  // omp parallel
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}